

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFuzzyImageCompare.cpp
# Opt level: O2

deUint32 tcu::bilinearSample<4>(ConstPixelBufferAccess *src,float u,float v)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  
  iVar11 = (src->m_size).m_data[0];
  iVar7 = (src->m_size).m_data[1];
  fVar12 = floorf(u + -0.5);
  iVar10 = (int)fVar12;
  iVar9 = iVar10 + 1;
  fVar13 = floorf(v + -0.5);
  iVar6 = (int)fVar13;
  iVar11 = iVar11 + -1;
  iVar2 = iVar11;
  if (iVar10 < iVar11) {
    iVar2 = iVar10;
  }
  if (iVar9 < iVar11) {
    iVar11 = iVar9;
  }
  iVar11 = iVar11 << 2;
  iVar7 = iVar7 + -1;
  iVar8 = iVar7;
  if (iVar6 < iVar7) {
    iVar8 = iVar6;
  }
  iVar5 = 0;
  if (iVar6 < 0) {
    iVar8 = 0;
  }
  iVar6 = iVar6 + 1;
  if (iVar6 < iVar7) {
    iVar7 = iVar6;
  }
  if (iVar6 < 0) {
    iVar7 = 0;
  }
  pvVar1 = src->m_data;
  iVar6 = (src->m_pitch).m_data[1];
  iVar8 = iVar8 * iVar6;
  iVar2 = iVar2 << 2;
  if (iVar10 < 0) {
    iVar2 = iVar5;
  }
  fVar12 = (u + -0.5) - fVar12;
  fVar13 = (v + -0.5) - fVar13;
  if (iVar9 < 0) {
    iVar11 = 0;
  }
  iVar7 = iVar7 * iVar6;
  uVar3 = 0;
  for (; iVar5 != 0x20; iVar5 = iVar5 + 8) {
    bVar4 = (byte)iVar5;
    iVar9 = (int)((float)(*(uint *)((long)pvVar1 + (long)iVar11 + (long)iVar7) >> (bVar4 & 0x1f) &
                         0xff) * fVar12 * fVar13 +
                  (float)(*(uint *)((long)pvVar1 + (long)iVar2 + (long)iVar7) >> (bVar4 & 0x1f) &
                         0xff) * (1.0 - fVar12) * fVar13 +
                  (float)(*(uint *)((long)pvVar1 + (long)iVar2 + (long)iVar8) >> (bVar4 & 0x1f) &
                         0xff) * (1.0 - fVar12) * (1.0 - fVar13) +
                  (float)(*(uint *)((long)pvVar1 + (long)iVar11 + (long)iVar8) >> (bVar4 & 0x1f) &
                         0xff) * fVar12 * (1.0 - fVar13) + 0.5);
    if (0xfe < iVar9) {
      iVar9 = 0xff;
    }
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    uVar3 = uVar3 & ~(0xff << (bVar4 & 0x1f)) | iVar9 << (bVar4 & 0x1f);
  }
  return uVar3;
}

Assistant:

inline deUint32 bilinearSample (const ConstPixelBufferAccess& src, float u, float v)
{
	int w = src.getWidth();
	int h = src.getHeight();

	int x0 = deFloorFloatToInt32(u-0.5f);
	int x1 = x0+1;
	int y0 = deFloorFloatToInt32(v-0.5f);
	int y1 = y0+1;

	int i0 = de::clamp(x0, 0, w-1);
	int i1 = de::clamp(x1, 0, w-1);
	int j0 = de::clamp(y0, 0, h-1);
	int j1 = de::clamp(y1, 0, h-1);

	float a = deFloatFrac(u-0.5f);
	float b = deFloatFrac(v-0.5f);

	deUint32 p00	= readUnorm8<NumChannels>(src, i0, j0);
	deUint32 p10	= readUnorm8<NumChannels>(src, i1, j0);
	deUint32 p01	= readUnorm8<NumChannels>(src, i0, j1);
	deUint32 p11	= readUnorm8<NumChannels>(src, i1, j1);
	deUint32 dst	= 0;

	// Interpolate.
	for (int c = 0; c < NumChannels; c++)
	{
		float f = (getChannel(p00, c)*(1.0f-a)*(1.0f-b)) +
				  (getChannel(p10, c)*(     a)*(1.0f-b)) +
				  (getChannel(p01, c)*(1.0f-a)*(     b)) +
				  (getChannel(p11, c)*(     a)*(     b));
		dst = setChannel(dst, c, roundToUint8Sat(f));
	}

	return dst;
}